

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint64_t farmhash_xo_h32(char *s,size_t len,uint64_t mul,uint64_t seed0,uint64_t seed1)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = *(long *)(s + 0x18) * len;
  uVar1 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
  uVar2 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
  uVar2 = (uVar2 >> 0x12 | uVar2 << 0x2e) + uVar3 + *(long *)s * -0x4b6d499041670d8d + seed0;
  uVar1 = ((uVar3 >> 0x1e | uVar3 << 0x22) + mul + (uVar1 >> 0x2b | uVar1 * 0x200000) +
           *(long *)(s + 0x10) * -0x651e95c4d06fbfb1 ^ uVar2) * len;
  uVar1 = (uVar1 >> 0x2f ^ uVar2 ^ uVar1) * len;
  return uVar1 >> 0x2f ^ uVar1;
}

Assistant:

static inline uint64_t farmhash_xo_h32(const char *s, size_t len, uint64_t mul,
                           uint64_t seed0, uint64_t seed1) {
  uint64_t a = fetch64(s) * k1;
  uint64_t b = fetch64(s + 8);
  uint64_t c = fetch64(s + len - 8) * mul;
  uint64_t d = fetch64(s + len - 16) * k2;
  uint64_t u = ror64(a + b, 43) + ror64(c, 30) + d + seed0;
  uint64_t v = a + ror64(b + k2, 18) + c + seed1;
  a = smix((u ^ v) * mul);
  b = smix((v ^ a) * mul);
  return b;
}